

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Logical_Or_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Logical_Or_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  bool bVar1;
  bool b;
  Dispatch_State *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Boxed_Value BVar3;
  undefined1 auStack_48 [16];
  undefined1 local_38 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_38,
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)local_38,in_RDX);
  b = true;
  if (!bVar1) {
    AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)auStack_48,
               *(Dispatch_State **)
                ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock +
                8));
    b = AST_Node::get_bool_condition((Boxed_Value *)auStack_48,in_RDX);
  }
  BVar3 = const_var((chaiscript *)this,b);
  _Var2._M_pi = BVar3.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((!bVar1) &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_);
    _Var2._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    _Var2._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        return const_var(this->get_bool_condition(this->children[0]->eval(t_ss), t_ss)
                         || this->get_bool_condition(this->children[1]->eval(t_ss), t_ss));
      }